

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::insert
          (NumberStringBuilder *this,int32_t index,UnicodeString *unistr,int32_t start,int32_t end,
          Field field,UErrorCode *status)

{
  UBool UVar1;
  char16_t cVar2;
  int count_00;
  int32_t iVar3;
  char16_t *pcVar4;
  Field *pFVar5;
  int local_40;
  int32_t i;
  int32_t position;
  int32_t count;
  Field field_local;
  int32_t end_local;
  int32_t start_local;
  UnicodeString *unistr_local;
  int32_t index_local;
  NumberStringBuilder *this_local;
  
  count_00 = end - start;
  iVar3 = prepareForInsert(this,index,count_00,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    for (local_40 = 0; local_40 < count_00; local_40 = local_40 + 1) {
      cVar2 = UnicodeString::charAt(unistr,start + local_40);
      pcVar4 = getCharPtr(this);
      pcVar4[iVar3 + local_40] = cVar2;
      pFVar5 = getFieldPtr(this);
      pFVar5[iVar3 + local_40] = field;
    }
  }
  return count_00;
}

Assistant:

int32_t
NumberStringBuilder::insert(int32_t index, const UnicodeString &unistr, int32_t start, int32_t end,
                            Field field, UErrorCode &status) {
    int32_t count = end - start;
    int32_t position = prepareForInsert(index, count, status);
    if (U_FAILURE(status)) {
        return count;
    }
    for (int32_t i = 0; i < count; i++) {
        getCharPtr()[position + i] = unistr.charAt(start + i);
        getFieldPtr()[position + i] = field;
    }
    return count;
}